

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O1

Result * __thiscall
duckdb_httplib::ClientImpl::Get
          (Result *__return_storage_ptr__,ClientImpl *this,string *path,Headers *headers,
          Progress *progress)

{
  Request req;
  undefined1 local_2b0 [32];
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  int local_200;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  int local_1d8;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Rb_tree_node_base local_188;
  size_t local_168;
  _Rb_tree_node_base local_158;
  size_t local_138;
  pointer ppStack_130;
  pointer local_128;
  pointer ppStack_120;
  pointer local_118;
  pointer pGStack_110;
  pointer local_108;
  __node_base_ptr *local_100;
  size_type local_f8;
  __node_base local_f0;
  size_type sStack_e8;
  float local_e0;
  size_t local_d8;
  __node_base_ptr p_Stack_d0;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type p_Stack_b0;
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  size_t local_68;
  size_t local_60;
  _Any_data _Stack_58;
  undefined1 uStack_48;
  undefined7 local_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  size_t local_30;
  
  local_2b0._0_8_ = local_2b0 + 0x10;
  local_2b0._8_8_ = 0;
  local_2b0[0x10] = '\0';
  local_290._M_p = (pointer)&local_280;
  local_288 = 0;
  local_280._M_local_buf[0] = '\0';
  local_270._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_270._M_impl.super__Rb_tree_header._M_header;
  local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_270._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240._M_p = (pointer)&local_230;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_220._M_p = (pointer)&local_210;
  local_218 = 0;
  local_210._M_local_buf[0] = '\0';
  local_200 = -1;
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1d8 = -1;
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0._M_p = (pointer)&local_1a0;
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_188._M_left = &local_188;
  local_188._M_color = _S_red;
  local_188._M_parent = (_Base_ptr)0x0;
  local_168 = 0;
  local_158._M_left = &local_158;
  local_158._M_color = _S_red;
  local_158._M_parent = (_Base_ptr)0x0;
  local_100 = &p_Stack_d0;
  local_108 = (pointer)0x0;
  local_118 = (pointer)0x0;
  pGStack_110 = (pointer)0x0;
  local_128 = (pointer)0x0;
  ppStack_120 = (pointer)0x0;
  local_138 = 0;
  ppStack_130 = (pointer)0x0;
  local_f8 = 1;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  sStack_e8 = 0;
  local_e0 = 1.0;
  local_d8 = 0;
  p_Stack_d0 = (__node_base_ptr)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  p_Stack_b0 = (_Invoker_type)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (_Manager_type)0x0;
  p_Stack_90 = (_Invoker_type)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (_Manager_type)0x0;
  p_Stack_70 = (_Invoker_type)0x0;
  local_68 = 0x14;
  local_30 = 0;
  uStack_40 = 0;
  uStack_3f = 0;
  _Stack_58._8_8_ = 0;
  uStack_48 = 0;
  local_47 = 0;
  local_60 = 0;
  _Stack_58._M_unused._M_object = (void *)0x0;
  local_270._M_impl.super__Rb_tree_header._M_header._M_right =
       local_270._M_impl.super__Rb_tree_header._M_header._M_left;
  local_188._M_right = local_188._M_left;
  local_158._M_right = local_158._M_left;
  std::__cxx11::string::_M_replace((ulong)local_2b0,0,(char *)0x0,0x1df9eec);
  std::__cxx11::string::_M_assign((string *)&local_290);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_270,&headers->_M_t);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=
            ((function<bool_(unsigned_long,_unsigned_long)> *)&local_88,progress);
  send_(__return_storage_ptr__,this,(Request *)local_2b0);
  Request::~Request((Request *)local_2b0);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Get(const std::string &path, const Headers &headers,
                              Progress progress) {
  Request req;
  req.method = "GET";
  req.path = path;
  req.headers = headers;
  req.progress = std::move(progress);

  return send_(std::move(req));
}